

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement * build_ir_whilestmt(Context_conflict *ctx,MOJOSHADER_astWhileStatement *ast)

{
  int index;
  int iffalse;
  int iftrue;
  LoopLabels *pLVar1;
  MOJOSHADER_irStatement *pMVar2;
  MOJOSHADER_irExpression *left;
  MOJOSHADER_irExpression *right;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *next;
  MOJOSHADER_irStatement *retval;
  int join;
  int t;
  int loop;
  LoopLabels *labels;
  MOJOSHADER_astWhileStatement *ast_local;
  Context_conflict *ctx_local;
  
  if (ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL) {
    pLVar1 = push_ir_loop(ctx,0);
    if (pLVar1 == (LoopLabels *)0x0) {
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      index = pLVar1->start;
      iftrue = generate_ir_label(ctx);
      iffalse = pLVar1->end;
      pMVar2 = new_ir_label(ctx,index);
      left = build_ir_expr(ctx,ast->expr);
      right = new_ir_constbool(ctx,1);
      pMVar3 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,left,right,iftrue,iffalse);
      pMVar4 = new_ir_label(ctx,iftrue);
      pMVar5 = build_ir_stmt(ctx,ast->statement);
      pMVar6 = new_ir_jump(ctx,index);
      next = new_ir_label(ctx,iffalse);
      pMVar6 = new_ir_seq(ctx,pMVar6,next);
      pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
      pMVar4 = new_ir_seq(ctx,pMVar4,pMVar5);
      pMVar3 = new_ir_seq(ctx,pMVar3,pMVar4);
      pMVar2 = new_ir_seq(ctx,pMVar2,pMVar3);
      pop_ir_loop(ctx);
      pMVar3 = build_ir_stmt(ctx,ast->next);
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar2,pMVar3);
    }
    return (MOJOSHADER_irStatement *)ctx_local;
  }
  __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x13b4,
                "MOJOSHADER_irStatement *build_ir_whilestmt(Context *, const MOJOSHADER_astWhileStatement *)"
               );
}

Assistant:

static MOJOSHADER_irStatement *build_ir_whilestmt(Context *ctx,
                                          const MOJOSHADER_astWhileStatement *ast)
{
    // !!! FIXME: ast->unroll

    assert(ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    /* The gist...
        loop:
            cjump expr == true, t, join
        t:
            statement
            jump loop
        join:
    */

    const LoopLabels *labels = push_ir_loop(ctx, 0);
    if (labels == NULL)
        return NULL;  // out of memory...

    const int loop = labels->start;
    const int t = generate_ir_label(ctx);
    const int join = labels->end;

    MOJOSHADER_irStatement *retval =
        new_ir_seq(ctx, new_ir_label(ctx, loop),
        new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), t, join),
        new_ir_seq(ctx, new_ir_label(ctx, t),
        new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
        new_ir_seq(ctx, new_ir_jump(ctx, loop),
                        new_ir_label(ctx, join))))));

    pop_ir_loop(ctx);

    return new_ir_seq(ctx, retval, build_ir_stmt(ctx, ast->next));
}